

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

int HandleRequestWithPreloaded
              (CP_Services Svcs,Evpath_RS_Stream RS_Stream,int Rank,size_t Timestep,size_t Offset,
              size_t Length,void *Buffer)

{
  _RSTimestepEntry *p_Var1;
  CP_VerboseFunc p_Var2;
  void *pvVar3;
  uint64_t uVar4;
  _RSTimestepEntry **pp_Var5;
  
  pp_Var5 = &RS_Stream->QueuedTimesteps;
  while( true ) {
    p_Var1 = *pp_Var5;
    if (p_Var1 == (_RSTimestepEntry *)0x0) {
      return 0;
    }
    if ((p_Var1->WriterRank == Rank) && (p_Var1->Timestep == Timestep)) break;
    pp_Var5 = &p_Var1->Next;
  }
  p_Var2 = Svcs->verbose;
  pvVar3 = RS_Stream->CP_Stream;
  uVar4 = writeBlockFingerprint(p_Var1->Data,p_Var1->DataSize);
  (*p_Var2)(pvVar3,5,
            "Satisfying remote memory read with preload from writer rank %d for timestep %ld, fprint %lx\n"
            ,(ulong)(uint)Rank,Timestep,uVar4);
  memcpy(Buffer,p_Var1->Data + Offset,Length);
  return 1;
}

Assistant:

static int HandleRequestWithPreloaded(CP_Services Svcs, Evpath_RS_Stream RS_Stream, int Rank,
                                      size_t Timestep, size_t Offset, size_t Length, void *Buffer)
{
    RSTimestepList Entry = NULL;
    Entry = RS_Stream->QueuedTimesteps;
    while (Entry && ((Entry->WriterRank != Rank) || (Entry->Timestep != Timestep)))
    {
        Entry = Entry->Next;
    }
    if (!Entry)
    {
        return 0;
    }
    Svcs->verbose(RS_Stream->CP_Stream, DPTraceVerbose,
                  "Satisfying remote memory read with preload from writer rank "
                  "%d for timestep %ld, fprint %lx\n",
                  Rank, Timestep, writeBlockFingerprint(Entry->Data, Entry->DataSize));
    memcpy(Buffer, Entry->Data + Offset, Length);
    return 1;
}